

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

void ma_dr_wav_s24_to_s32(ma_int32 *pOut,ma_uint8 *pIn,size_t sampleCount)

{
  ma_int32 sample32;
  uint s2;
  uint s1;
  uint s0;
  size_t i;
  size_t sampleCount_local;
  ma_uint8 *pIn_local;
  ma_int32 *pOut_local;
  
  if ((pOut != (ma_int32 *)0x0) && (pIn != (ma_uint8 *)0x0)) {
    pOut_local = pOut;
    for (i = 0; i < sampleCount; i = i + 1) {
      *pOut_local = (uint)pIn[i * 3] << 8 | (uint)pIn[i * 3 + 1] << 0x10 |
                    (uint)pIn[i * 3 + 2] << 0x18;
      pOut_local = pOut_local + 1;
    }
  }
  return;
}

Assistant:

MA_API void ma_dr_wav_s24_to_s32(ma_int32* pOut, const ma_uint8* pIn, size_t sampleCount)
{
    size_t i;
    if (pOut == NULL || pIn == NULL) {
        return;
    }
    for (i = 0; i < sampleCount; ++i) {
        unsigned int s0 = pIn[i*3 + 0];
        unsigned int s1 = pIn[i*3 + 1];
        unsigned int s2 = pIn[i*3 + 2];
        ma_int32 sample32 = (ma_int32)((s0 << 8) | (s1 << 16) | (s2 << 24));
        *pOut++ = sample32;
    }
}